

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

Interpolations *
testing::internal::ValidateMatcherDescription
          (Interpolations *__return_storage_ptr__,char **param_names,char *description)

{
  pointer *ppIVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  String *in_RCX;
  ostream *poVar7;
  String *pSVar8;
  char *p;
  string param_name;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  String *local_98;
  string local_90;
  string local_70;
  Interpolations *local_50;
  internal *local_48;
  AssertHelper local_40;
  char **local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*description != '\0') {
    local_98 = (String *)description;
    local_50 = __return_storage_ptr__;
    local_48 = (internal *)description;
    local_38 = param_names;
    do {
      bVar3 = SkipPrefix("%%",(char **)&local_98);
      if (bVar3) {
        in_RCX = (String *)((long)&((string *)(local_98 + -1))->_M_string_length + 6);
        local_90._M_string_length = (size_type)local_98;
        local_90.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_90._M_dataplus._M_p = (pointer)in_RCX;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
          ::_M_realloc_insert<testing::internal::Interpolation>
                    (__return_storage_ptr__,iVar2,(Interpolation *)&local_90);
        }
        else {
          *(ulong *)&(iVar2._M_current)->param_index =
               CONCAT44(local_90.field_2._M_allocated_capacity._4_4_,0xfffffffe);
          (iVar2._M_current)->start_pos = (char *)in_RCX;
          (iVar2._M_current)->end_pos = (char *)local_98;
          ppIVar1 = &(__return_storage_ptr__->
                     super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
      }
      else {
        bVar3 = SkipPrefix("%(",(char **)&local_98);
        pSVar8 = local_98;
        if (bVar3) {
          pcVar5 = strstr((char *)local_98,")s");
          if (pcVar5 == (char *)0x0) {
            Message::Message((Message *)&local_70);
            pcVar5 = (char *)((long)&((string *)(pSVar8 + -1))->_M_string_length + 6);
            FormatMatcherDescriptionSyntaxError_abi_cxx11_(&local_90,local_48,pcVar5,(char *)in_RCX)
            ;
            poVar7 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
            if ((long *)local_70._M_dataplus._M_p == (long *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
            poVar7 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
            if ((long *)local_70._M_dataplus._M_p == (long *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"an interpolation must end with \")s\", ",0x25);
            poVar7 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
            if ((long *)local_70._M_dataplus._M_p == (long *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"but \"",5);
            poVar7 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
            if ((long *)local_70._M_dataplus._M_p == (long *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar6);
            poVar7 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
            if ((long *)local_70._M_dataplus._M_p == (long *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" does not.",0xb);
            in_RCX = (String *)0x2317;
            AssertHelper::AssertHelper
                      (&local_a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,0x2317,"Failed");
            AssertHelper::operator=(&local_a0,(Message *)&local_70);
            AssertHelper::~AssertHelper(&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
            }
          }
          else {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pSVar8,pcVar5);
            iVar4 = GetParamIndex(local_38,&local_90);
            if (iVar4 == -3) {
              Message::Message((Message *)&local_a0);
              FormatMatcherDescriptionSyntaxError_abi_cxx11_
                        (&local_70,local_48,(char *)pSVar8,(char *)in_RCX);
              poVar7 = (ostream *)&(local_a0.data_)->line;
              if (local_a0.data_ == (AssertHelperData *)0x0) {
                poVar7 = (ostream *)0x0;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
              poVar7 = (ostream *)&(local_a0.data_)->line;
              if (local_a0.data_ == (AssertHelperData *)0x0) {
                poVar7 = (ostream *)0x0;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
              poVar7 = (ostream *)&(local_a0.data_)->line;
              if (local_a0.data_ == (AssertHelperData *)0x0) {
                poVar7 = (ostream *)0x0;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
              poVar7 = (ostream *)&(local_a0.data_)->line;
              if (local_a0.data_ == (AssertHelperData *)0x0) {
                poVar7 = (ostream *)0x0;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" is an invalid parameter name.",0x1f);
              in_RCX = (String *)0x231e;
              AssertHelper::AssertHelper
                        (&local_40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                         ,0x231e,"Failed");
              __return_storage_ptr__ = local_50;
              AssertHelper::operator=(&local_40,(Message *)&local_a0);
              AssertHelper::~AssertHelper(&local_40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if (local_a0.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_a0.data_ + 8))();
              }
            }
            else {
              local_70._M_dataplus._M_p =
                   (pointer)((long)&((string *)(pSVar8 + -1))->_M_string_length + 6);
              pSVar8 = (String *)(pcVar5 + 2);
              iVar2._M_current =
                   (local_50->
                   super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_70._M_string_length = (size_type)pSVar8;
              local_70.field_2._M_allocated_capacity._0_4_ = iVar4;
              if (iVar2._M_current ==
                  (local_50->
                  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                ::_M_realloc_insert<testing::internal::Interpolation>
                          (local_50,iVar2,(Interpolation *)&local_70);
                __return_storage_ptr__ = local_50;
                local_98 = pSVar8;
              }
              else {
                *(ulong *)&(iVar2._M_current)->param_index =
                     CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,iVar4);
                (iVar2._M_current)->start_pos = local_70._M_dataplus._M_p;
                (iVar2._M_current)->end_pos = (char *)pSVar8;
                ppIVar1 = &(local_50->
                           super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + 1;
                __return_storage_ptr__ = local_50;
                local_98 = pSVar8;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
          }
        }
        else {
          local_90._M_dataplus._M_p._0_1_ = 0x25;
          in_RCX = local_98;
          CmpHelperNE<char,char>
                    ((internal *)&local_70,"*p","\'%\'",(char *)local_98,(char *)&local_90);
          if ((char)local_70._M_dataplus._M_p == '\0') {
            Message::Message((Message *)&local_a0);
            FormatMatcherDescriptionSyntaxError_abi_cxx11_
                      (&local_90,local_48,(char *)pSVar8,(char *)in_RCX);
            poVar7 = (ostream *)&(local_a0.data_)->line;
            if (local_a0.data_ == (AssertHelperData *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
            poVar7 = (ostream *)&(local_a0.data_)->line;
            if (local_a0.data_ == (AssertHelperData *)0x0) {
              poVar7 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"use \"%%\" instead of \"%\" to print \"%\".",0x25);
            pcVar5 = "";
            if (((String *)local_70._M_string_length != (String *)0x0) &&
               (pcVar5 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_70._M_string_length)->_M_allocated_capacity,
               pcVar5 == (char *)0x0)) {
              pcVar5 = "";
            }
            in_RCX = (String *)0x2327;
            AssertHelper::AssertHelper
                      (&local_40,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,8999,pcVar5);
            AssertHelper::operator=(&local_40,(Message *)&local_a0);
            AssertHelper::~AssertHelper(&local_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if (local_a0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
          }
          scoped_ptr<testing::internal::String>::reset
                    ((scoped_ptr<testing::internal::String> *)&local_70._M_string_length,
                     (String *)0x0);
          local_98 = (String *)
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)&pSVar8->c_str_)->_M_local_buf + 1);
        }
      }
    } while (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_98->c_str_)->_M_local_buf[0] != '\0');
  }
  return __return_storage_ptr__;
}

Assistant:

Interpolations ValidateMatcherDescription(
    const char* param_names[], const char* description) {
  Interpolations interps;
  for (const char* p = description; *p != '\0';) {
    if (SkipPrefix("%%", &p)) {
      interps.push_back(Interpolation(p - 2, p, kPercentInterpolation));
    } else if (SkipPrefix("%(", &p)) {
      const char* const q = strstr(p, ")s");
      if (q == NULL) {
        // TODO(wan@google.com): change the source file location in
        // the failure to point to where the MATCHER*() macro is used.
        ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p - 2)
                      << "an interpolation must end with \")s\", "
                      << "but \"" << (p - 2) << "\" does not.";
      } else {
        const string param_name(p, q);
        const int param_index = GetParamIndex(param_names, param_name);
        if (param_index == kInvalidInterpolation) {
          ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p)
                        << "\"" << param_name
                        << "\" is an invalid parameter name.";
        } else {
          interps.push_back(Interpolation(p - 2, q + 2, param_index));
          p = q + 2;
        }
      }
    } else {
      EXPECT_NE(*p, '%') << FormatMatcherDescriptionSyntaxError(description, p)
                         << "use \"%%\" instead of \"%\" to print \"%\".";
      ++p;
    }
  }
  return interps;
}